

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match_results.hpp
# Opt level: O1

case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
* __thiscall
boost::xpressive::match_results<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>::
format_escape_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::case_converting_iterator<std::back_insert_iterator<std::__cxx11::string>,char>>
          (case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
           *__return_storage_ptr__,
          match_results<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *this,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *cur,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               end,case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
                   out)

{
  byte *pbVar1;
  byte *pbVar2;
  char cVar3;
  int iVar4;
  const_reference pvVar5;
  byte ch;
  range_check_result rVar6;
  unsigned_long line;
  char *pcVar7;
  size_type index;
  uint uVar8;
  sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  long lVar9;
  bool cond;
  undefined1 local_78 [16];
  _func_int **local_68;
  refcount_ptr<boost::exception_detail::error_info_container> local_60;
  char *pcStack_58;
  char *local_50;
  undefined8 local_48;
  error_type local_40;
  char *local_38;
  
  pbVar2 = (byte *)cur->_M_current;
  local_68 = out._16_8_;
  if (pbVar2 == (byte *)end._M_current) {
    ch = 0x5c;
    goto LAB_0013f455;
  }
  pbVar1 = pbVar2 + 1;
  cur->_M_current = (char *)pbVar1;
  ch = *pbVar2;
  if (ch < 0x61) {
    if (ch == 0x45) {
      out.rest_ = op_none;
      goto LAB_0013f45a;
    }
    if (ch == 0x4c) {
      out.rest_ = op_lower;
      goto LAB_0013f45a;
    }
    if (ch == 0x55) {
      out.rest_ = op_upper;
      goto LAB_0013f45a;
    }
switchD_0013f411_caseD_62:
    iVar4 = (**(code **)(**(long **)(this + 0x80) + 0x28))(*(long **)(this + 0x80),(int)(char)ch,10)
    ;
    if (0 < iVar4) {
      iVar4 = (**(code **)(**(long **)(this + 0x80) + 0x28))
                        (*(long **)(this + 0x80),(int)(char)ch,10);
      this_00 = (sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(this + 8);
      index = (size_type)iVar4;
      pvVar5 = detail::
               sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](this_00,index);
      if (pvVar5->matched == true) {
        pvVar5 = detail::
                 sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](this_00,index);
        pcVar7 = (pvVar5->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).first._M_current;
        pvVar5 = detail::
                 sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](this_00,index);
        local_78._0_8_ = out.out_.container;
        local_78._8_8_ = out.traits_;
        lVar9 = (long)(pvVar5->
                      super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ).second._M_current - (long)pcVar7;
        if (0 < lVar9) {
          lVar9 = lVar9 + 1;
          do {
            detail::
            case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
            ::operator=((case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
                         *)local_78,*pcVar7);
            pcVar7 = pcVar7 + 1;
            local_68 = (_func_int **)((ulong)local_68 & 0xffffffff00000000);
            lVar9 = lVar9 + -1;
          } while (1 < lVar9);
        }
        out.next_ = (transform_op)local_68;
        out.rest_ = (transform_op)((ulong)local_68 >> 0x20);
        out.out_.container =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._0_8_;
        out.traits_ = (traits<char> *)local_78._8_8_;
      }
      goto LAB_0013f45a;
    }
    goto LAB_0013f455;
  }
  switch(ch) {
  case 0x61:
    ch = 7;
    break;
  default:
    goto switchD_0013f411_caseD_62;
  case 99:
    if (pbVar1 == (byte *)end._M_current) {
      std::runtime_error::runtime_error((runtime_error *)local_78,"unexpected end of format found");
      local_60.px_ = (error_info_container *)0x0;
      local_78._0_8_ = &PTR__regex_error_00195328;
      local_68 = (_func_int **)&PTR__regex_error_00195350;
      local_40 = error_escape;
      pcStack_58 = 
      "OutputIterator boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::format_escape_(ForwardIterator &, ForwardIterator, OutputIterator) const [BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, ForwardIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, OutputIterator = boost::xpressive::detail::case_converting_iterator<std::back_insert_iterator<std::basic_string<char>>, char>]"
      ;
      local_50 = 
      "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O1/KWStyle/Utilities/boost/xpressive/match_results.hpp"
      ;
      local_48._0_4_ = 0x4e2;
      local_48._4_4_ = -1;
      throw_exception<boost::xpressive::regex_error>((regex_error *)local_78);
    }
    cVar3 = (**(code **)(**(long **)(this + 0x80) + 0x20))
                      (*(long **)(this + 0x80),0x61,0x7a,(int)(char)*pbVar1);
    if ((cVar3 == '\0') &&
       (cVar3 = (**(code **)(**(long **)(this + 0x80) + 0x20))
                          (*(long **)(this + 0x80),0x41,0x5a,(int)*cur->_M_current), cVar3 == '\0'))
    {
      std::runtime_error::runtime_error
                ((runtime_error *)local_78,
                 "invalid escape control letter; must be one of a-z or A-Z");
      local_60.px_ = (error_info_container *)0x0;
      local_78._0_8_ = &PTR__regex_error_00195328;
      local_68 = (_func_int **)&PTR__regex_error_00195350;
      local_40 = error_escape;
      pcStack_58 = 
      "OutputIterator boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::format_escape_(ForwardIterator &, ForwardIterator, OutputIterator) const [BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, ForwardIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, OutputIterator = boost::xpressive::detail::case_converting_iterator<std::back_insert_iterator<std::basic_string<char>>, char>]"
      ;
      local_50 = 
      "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O1/KWStyle/Utilities/boost/xpressive/match_results.hpp"
      ;
      local_48._0_4_ = 0x4e9;
      local_48._4_4_ = -1;
      throw_exception<boost::xpressive::regex_error>((regex_error *)local_78);
    }
    uVar8 = (int)*cur->_M_current % 0x20;
    detail::char_overflow_handler_::operator()((char_overflow_handler_ *)local_78,uVar8 >> 0x1f);
    local_78._0_8_ = out.out_.container;
    local_78._8_8_ = out.traits_;
    out.next_ = op_none;
    detail::
    case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
    ::operator=((case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
                 *)local_78,(char)uVar8);
    cur->_M_current = cur->_M_current + 1;
    goto LAB_0013f45a;
  case 0x65:
    ch = 0x1b;
    break;
  case 0x66:
    ch = 0xc;
    break;
  case 0x6c:
    out.next_ = op_lower;
    goto LAB_0013f45a;
  case 0x6e:
    ch = 10;
    break;
  case 0x72:
    ch = 0xd;
    break;
  case 0x74:
    ch = 9;
    break;
  case 0x75:
    out.next_ = op_upper;
    goto LAB_0013f45a;
  case 0x76:
    ch = 0xb;
    break;
  case 0x78:
    if (pbVar1 == (byte *)end._M_current) {
      std::runtime_error::runtime_error((runtime_error *)local_78,"unexpected end of format found");
      local_60.px_ = (error_info_container *)0x0;
      local_78._0_8_ = &PTR__regex_error_00195328;
      local_68 = (_func_int **)&PTR__regex_error_00195350;
      local_40 = error_escape;
      pcStack_58 = 
      "OutputIterator boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::format_escape_(ForwardIterator &, ForwardIterator, OutputIterator) const [BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, ForwardIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, OutputIterator = boost::xpressive::detail::case_converting_iterator<std::back_insert_iterator<std::basic_string<char>>, char>]"
      ;
      local_50 = 
      "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O1/KWStyle/Utilities/boost/xpressive/match_results.hpp"
      ;
      local_48._0_4_ = 0x4cf;
      local_48._4_4_ = -1;
      throw_exception<boost::xpressive::regex_error>((regex_error *)local_78);
    }
    if (*pbVar1 == 0x7b) {
      cur->_M_current = (char *)(pbVar2 + 2);
      detail::ensure_(pbVar2 + 2 != (byte *)end._M_current,error_escape,
                      "unexpected end of format found",
                      "OutputIterator boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::format_escape_(ForwardIterator &, ForwardIterator, OutputIterator) const [BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, ForwardIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, OutputIterator = boost::xpressive::detail::case_converting_iterator<std::back_insert_iterator<std::basic_string<char>>, char>]"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O1/KWStyle/Utilities/boost/xpressive/match_results.hpp"
                      ,0x4d2);
      local_38 = cur->_M_current;
      iVar4 = detail::
              toi<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::traits<char>>
                        (cur,end,*(traits<char> **)(this + 0x80),0x10,0xffff);
      rVar6 = cNegOverflow;
      if (-1 < iVar4) {
        rVar6 = (uint)(0xff < iVar4) * 2;
      }
      detail::char_overflow_handler_::operator()((char_overflow_handler_ *)local_78,rVar6);
      local_78._0_8_ = out.out_.container;
      local_78._8_8_ = out.traits_;
      detail::
      case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
      ::operator=((case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
                   *)local_78,(char)iVar4);
      pcVar7 = cur->_M_current;
      cond = false;
      if ((pcVar7 != end._M_current) && (cond = false, (long)pcVar7 - (long)local_38 == 4)) {
        cur->_M_current = pcVar7 + 1;
        cond = *pcVar7 == '}';
      }
      pcVar7 = "invalid hex escape : must be \\x { HexDigit HexDigit HexDigit HexDigit }";
      line = 0x4d6;
    }
    else {
      local_38 = cur->_M_current;
      iVar4 = detail::
              toi<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::traits<char>>
                        (cur,end,*(traits<char> **)(this + 0x80),0x10,0xff);
      rVar6 = cNegOverflow;
      if (-1 < iVar4) {
        rVar6 = (uint)(0xff < iVar4) * 2;
      }
      detail::char_overflow_handler_::operator()((char_overflow_handler_ *)local_78,rVar6);
      local_78._0_8_ = out.out_.container;
      local_78._8_8_ = out.traits_;
      detail::
      case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
      ::operator=((case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
                   *)local_78,(char)iVar4);
      cond = (long)cur->_M_current - (long)local_38 == 2;
      pcVar7 = "invalid hex escape : must be \\x HexDigit HexDigit";
      line = 0x4dd;
    }
    out.next_ = op_none;
    detail::ensure_(cond,error_escape,pcVar7,
                    "OutputIterator boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::format_escape_(ForwardIterator &, ForwardIterator, OutputIterator) const [BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, ForwardIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, OutputIterator = boost::xpressive::detail::case_converting_iterator<std::back_insert_iterator<std::basic_string<char>>, char>]"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O1/KWStyle/Utilities/boost/xpressive/match_results.hpp"
                    ,line);
    goto LAB_0013f45a;
  }
LAB_0013f455:
  local_78._8_8_ = out.traits_;
  local_78._0_8_ = out.out_.container;
  out.next_ = op_none;
  detail::
  case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
  ::operator=((case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
               *)local_78,ch);
LAB_0013f45a:
  __return_storage_ptr__->next_ = out.next_;
  __return_storage_ptr__->rest_ = out.rest_;
  (__return_storage_ptr__->out_).container = out.out_.container;
  __return_storage_ptr__->traits_ = out.traits_;
  return __return_storage_ptr__;
}

Assistant:

OutputIterator format_escape_
    (
        ForwardIterator &cur
      , ForwardIterator end
      , OutputIterator out
    ) const
    {
        using namespace regex_constants;
        ForwardIterator tmp;
        // define an unsigned type the same size as char_type
        typedef typename boost::uint_t<CHAR_BIT * sizeof(char_type)>::least uchar_t;
        BOOST_MPL_ASSERT_RELATION(sizeof(uchar_t), ==, sizeof(char_type));
        typedef numeric::conversion_traits<uchar_t, int> converstion_traits;
        numeric::converter<int, uchar_t, converstion_traits, detail::char_overflow_handler_> converter;

        if(cur == end)
        {
            *out++ = BOOST_XPR_CHAR_(char_type, '\\');
            return out;
        }

        char_type ch = *cur++;
        switch(ch)
        {
        case BOOST_XPR_CHAR_(char_type, 'a'):
            *out++ = BOOST_XPR_CHAR_(char_type, '\a');
            break;

        case BOOST_XPR_CHAR_(char_type, 'e'):
            *out++ = converter(27);
            break;

        case BOOST_XPR_CHAR_(char_type, 'f'):
            *out++ = BOOST_XPR_CHAR_(char_type, '\f');
            break;

        case BOOST_XPR_CHAR_(char_type, 'n'):
            *out++ = BOOST_XPR_CHAR_(char_type, '\n');
            break;

        case BOOST_XPR_CHAR_(char_type, 'r'):
            *out++ = BOOST_XPR_CHAR_(char_type, '\r');
            break;

        case BOOST_XPR_CHAR_(char_type, 't'):
            *out++ = BOOST_XPR_CHAR_(char_type, '\t');
            break;

        case BOOST_XPR_CHAR_(char_type, 'v'):
            *out++ = BOOST_XPR_CHAR_(char_type, '\v');
            break;

        case BOOST_XPR_CHAR_(char_type, 'x'):
            BOOST_XPR_ENSURE_(cur != end, error_escape, "unexpected end of format found");
            if(BOOST_XPR_CHAR_(char_type, '{') == *cur)
            {
                BOOST_XPR_ENSURE_(++cur != end, error_escape, "unexpected end of format found");
                tmp = cur;
                *out++ = converter(detail::toi(cur, end, *this->traits_, 16, 0xffff));
                BOOST_XPR_ENSURE_(4 == std::distance(tmp, cur) && cur != end && BOOST_XPR_CHAR_(char_type, '}') == *cur++
                  , error_escape, "invalid hex escape : must be \\x { HexDigit HexDigit HexDigit HexDigit }");
            }
            else
            {
                tmp = cur;
                *out++ = converter(detail::toi(cur, end, *this->traits_, 16, 0xff));
                BOOST_XPR_ENSURE_(2 == std::distance(tmp, cur), error_escape
                  , "invalid hex escape : must be \\x HexDigit HexDigit");
            }
            break;

        case BOOST_XPR_CHAR_(char_type, 'c'):
            BOOST_XPR_ENSURE_(cur != end, error_escape, "unexpected end of format found");
            BOOST_XPR_ENSURE_
            (
                this->traits_->in_range(BOOST_XPR_CHAR_(char_type, 'a'), BOOST_XPR_CHAR_(char_type, 'z'), *cur)
             || this->traits_->in_range(BOOST_XPR_CHAR_(char_type, 'A'), BOOST_XPR_CHAR_(char_type, 'Z'), *cur)
              , error_escape
              , "invalid escape control letter; must be one of a-z or A-Z"
            );
            // Convert to character according to ECMA-262, section 15.10.2.10:
            *out++ = converter(*cur % 32);
            ++cur;
            break;

        case BOOST_XPR_CHAR_(char_type, 'l'):
            if(!set_transform(out, detail::op_lower, detail::scope_next))
            {
                *out++ = BOOST_XPR_CHAR_(char_type, 'l');
            }
            break;

        case BOOST_XPR_CHAR_(char_type, 'L'):
            if(!set_transform(out, detail::op_lower, detail::scope_rest))
            {
                *out++ = BOOST_XPR_CHAR_(char_type, 'L');
            }
            break;

        case BOOST_XPR_CHAR_(char_type, 'u'):
            if(!set_transform(out, detail::op_upper, detail::scope_next))
            {
                *out++ = BOOST_XPR_CHAR_(char_type, 'u');
            }
            break;

        case BOOST_XPR_CHAR_(char_type, 'U'):
            if(!set_transform(out, detail::op_upper, detail::scope_rest))
            {
                *out++ = BOOST_XPR_CHAR_(char_type, 'U');
            }
            break;

        case BOOST_XPR_CHAR_(char_type, 'E'):
            if(!set_transform(out, detail::op_none, detail::scope_rest))
            {
                *out++ = BOOST_XPR_CHAR_(char_type, 'E');
            }
            break;

        default:
            // BUGBUG what about backreferences like \12 ?
            if(0 < this->traits_->value(ch, 10))
            {
                int sub = this->traits_->value(ch, 10);
                if(this->sub_matches_[ sub ].matched)
                    out = std::copy(this->sub_matches_[ sub ].first, this->sub_matches_[ sub ].second, out);
            }
            else
            {
                *out++ = ch;
            }
            break;
        }

        return out;
    }